

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_fixline(FuncState *fs,int line)

{
  Proto *f;
  
  f = fs->f;
  if (f->lineinfo[(long)fs->pc + -1] == -0x80) {
    fs->nabslineinfo = fs->nabslineinfo + -1;
    fs->iwthabs = 0x81;
    savelineinfo(fs,f,line);
    return;
  }
  fs->previousline = fs->previousline - (int)f->lineinfo[(long)fs->pc + -1];
  fs->iwthabs = fs->iwthabs + 0xff;
  savelineinfo(fs,f,line);
  return;
}

Assistant:

void luaK_fixline (FuncState *fs, int line) {
  removelastlineinfo(fs);
  savelineinfo(fs, fs->f, line);
}